

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

size_t __thiscall caffe::EmbedParameter::ByteSizeLong(EmbedParameter *this)

{
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  UnknownFieldSet *unknown_fields;
  size_t sVar4;
  size_t sStack_38;
  int cached_size;
  size_t total_size;
  EmbedParameter *this_local;
  
  sStack_38 = 0;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = EmbedParameter::unknown_fields(this);
    sStack_38 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  if (((this->_has_bits_).has_bits_[0] & 0x1f) != 0) {
    bVar1 = has_weight_filler(this);
    if (bVar1) {
      sVar4 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<caffe::FillerParameter>(this->weight_filler_);
      sStack_38 = sVar4 + 1 + sStack_38;
    }
    bVar1 = has_bias_filler(this);
    if (bVar1) {
      sVar4 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<caffe::FillerParameter>(this->bias_filler_);
      sStack_38 = sVar4 + 1 + sStack_38;
    }
    bVar1 = has_num_output(this);
    if (bVar1) {
      uVar2 = num_output(this);
      sVar4 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar2);
      sStack_38 = sVar4 + 1 + sStack_38;
    }
    bVar1 = has_input_dim(this);
    if (bVar1) {
      uVar2 = input_dim(this);
      sVar4 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar2);
      sStack_38 = sVar4 + 1 + sStack_38;
    }
    bVar1 = has_bias_term(this);
    if (bVar1) {
      sStack_38 = sStack_38 + 2;
    }
  }
  iVar3 = google::protobuf::internal::ToCachedSize(sStack_38);
  this->_cached_size_ = iVar3;
  return sStack_38;
}

Assistant:

size_t EmbedParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.EmbedParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  if (_has_bits_[0 / 32] & 31u) {
    // optional .caffe.FillerParameter weight_filler = 4;
    if (has_weight_filler()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->weight_filler_);
    }

    // optional .caffe.FillerParameter bias_filler = 5;
    if (has_bias_filler()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->bias_filler_);
    }

    // optional uint32 num_output = 1;
    if (has_num_output()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->num_output());
    }

    // optional uint32 input_dim = 2;
    if (has_input_dim()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->input_dim());
    }

    // optional bool bias_term = 3 [default = true];
    if (has_bias_term()) {
      total_size += 1 + 1;
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}